

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

void textui_prefs_init(void)

{
  flavor *pfVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  monster_x_attr = (uint8_t *)mem_zalloc((ulong)z_info->r_max);
  monster_x_char = (wchar_t *)mem_zalloc((ulong)z_info->r_max << 2);
  kind_x_attr = (uint8_t *)mem_zalloc((ulong)z_info->k_max);
  kind_x_char = (wchar_t *)mem_zalloc((ulong)z_info->k_max << 2);
  lVar5 = 0;
  do {
    pvVar2 = mem_zalloc(0x19);
    *(void **)((long)feat_x_attr + lVar5) = pvVar2;
    pvVar2 = mem_zalloc(100);
    *(void **)((long)feat_x_char + lVar5) = pvVar2;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  lVar5 = 0;
  do {
    pvVar2 = mem_zalloc((ulong)z_info->trap_max);
    *(void **)((long)trap_x_attr + lVar5) = pvVar2;
    pvVar2 = mem_zalloc((ulong)z_info->trap_max << 2);
    *(void **)((long)trap_x_char + lVar5) = pvVar2;
    lVar5 = lVar5 + 8;
    pfVar1 = flavors;
    uVar3 = flavor_max;
  } while (lVar5 != 0x20);
  for (; pfVar1 != (flavor *)0x0; pfVar1 = pfVar1->next) {
    uVar4 = (ulong)pfVar1->fidx;
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
      flavor_max = uVar4;
    }
  }
  flavor_x_attr = (uint8_t *)mem_zalloc(flavor_max + 1);
  flavor_x_char = (wchar_t *)mem_zalloc(flavor_max * 4 + 4);
  reset_visuals(false);
  return;
}

Assistant:

void textui_prefs_init(void)
{
	int i;
	struct flavor *f;

	monster_x_attr = mem_zalloc(z_info->r_max * sizeof(uint8_t));
	monster_x_char = mem_zalloc(z_info->r_max * sizeof(wchar_t));
	kind_x_attr = mem_zalloc(z_info->k_max * sizeof(uint8_t));
	kind_x_char = mem_zalloc(z_info->k_max * sizeof(wchar_t));
	for (i = 0; i < LIGHTING_MAX; i++) {
		feat_x_attr[i] = mem_zalloc(FEAT_MAX * sizeof(uint8_t));
		feat_x_char[i] = mem_zalloc(FEAT_MAX * sizeof(wchar_t));
	}
	for (i = 0; i < LIGHTING_MAX; i++) {
		trap_x_attr[i] = mem_zalloc(z_info->trap_max * sizeof(uint8_t));
		trap_x_char[i] = mem_zalloc(z_info->trap_max * sizeof(wchar_t));
	}
	for (f = flavors; f; f = f->next)
		if (flavor_max < f->fidx)
			flavor_max = f->fidx;
	flavor_x_attr = mem_zalloc((flavor_max + 1) * sizeof(uint8_t));
	flavor_x_char = mem_zalloc((flavor_max + 1) * sizeof(wchar_t));

	reset_visuals(false);
}